

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::core::Privkey::operator-=(Privkey *__return_storage_ptr__,Privkey *this,ByteData256 *right)

{
  Privkey *in_stack_ffffffffffffff48;
  Privkey *this_00;
  Privkey local_80;
  undefined1 local_60 [8];
  Privkey key;
  Privkey sk;
  ByteData256 *right_local;
  Privkey *this_local;
  
  this_00 = __return_storage_ptr__;
  Privkey((Privkey *)&key.is_compressed_,right,kMainnet,true);
  CreateNegate(&local_80,(Privkey *)&key.is_compressed_);
  CreateTweakAdd((Privkey *)local_60,this,&local_80);
  ~Privkey((Privkey *)0x45222f);
  operator=(this_00,in_stack_ffffffffffffff48);
  Privkey(this_00,in_stack_ffffffffffffff48);
  ~Privkey((Privkey *)0x45225f);
  ~Privkey((Privkey *)0x452268);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::operator-=(const ByteData256 &right) {
  Privkey sk(right);
  Privkey key = CreateTweakAdd(sk.CreateNegate());
  *this = key;
  return *this;
}